

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int32_t __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
::decode_run_pixels(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
                    *this,pixel_type ra,pixel_type *start_pos,int32_t pixel_count)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar8 = 0;
  do {
    bVar1 = decoder_strategy::read_bit(&this->super_decoder_strategy);
    if (!bVar1) {
      if (pixel_count != iVar8) {
        if (*(int32_t *)(J + (long)this->run_index_ * 4) < 1) {
          iVar2 = 0;
        }
        else {
          iVar2 = decoder_strategy::read_value
                            (&this->super_decoder_strategy,
                             *(int32_t *)(J + (long)this->run_index_ * 4));
        }
        bVar1 = pixel_count < iVar2 + iVar8;
        pixel_count = iVar2 + iVar8;
        if (bVar1) {
          impl::throw_jpegls_error(InvalidCompressedData);
        }
      }
      break;
    }
    iVar2 = this->run_index_;
    iVar6 = 1 << (J[(long)iVar2 * 4] & 0x1f);
    iVar4 = pixel_count - iVar8;
    iVar7 = iVar6;
    if (iVar4 < iVar6) {
      iVar7 = iVar4;
    }
    iVar8 = iVar8 + iVar7;
    if (pixel_count < iVar8) {
      __assert_fail("index <= pixel_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                    ,0x2d2,
                    "int32_t charls::jls_codec<charls::default_traits<unsigned short, unsigned short>, charls::decoder_strategy>::decode_run_pixels(pixel_type, pixel_type *, const int32_t) [Traits = charls::default_traits<unsigned short, unsigned short>, Strategy = charls::decoder_strategy]"
                   );
    }
    if (iVar6 <= iVar4) {
      if (0x1d < iVar2) {
        iVar2 = 0x1e;
      }
      this->run_index_ = iVar2 + 1;
    }
  } while (iVar8 != pixel_count);
  uVar3 = 0;
  uVar5 = 0;
  if (0 < pixel_count) {
    uVar5 = (ulong)(uint)pixel_count;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    start_pos[uVar3] = ra;
  }
  return pixel_count;
}

Assistant:

int32_t decode_run_pixels(pixel_type ra, pixel_type* start_pos, const int32_t pixel_count)
    {
        int32_t index{};
        while (Strategy::read_bit())
        {
            const int count{std::min(1 << J[run_index_], pixel_count - index)};
            index += count;
            ASSERT(index <= pixel_count);

            if (count == (1 << J[run_index_]))
            {
                increment_run_index();
            }

            if (index == pixel_count)
                break;
        }

        if (index != pixel_count)
        {
            // incomplete run.
            index += (J[run_index_] > 0) ? Strategy::read_value(J[run_index_]) : 0;
        }

        if (UNLIKELY(index > pixel_count))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        for (int32_t i{}; i < index; ++i)
        {
            start_pos[i] = ra;
        }

        return index;
    }